

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::torrent::attach_peer(torrent *this,peer_connection *p)

{
  _Atomic_word *p_Var1;
  int *piVar2;
  vector<peer_connection_*> *this_00;
  peer_class_t c;
  ip_filter *this_01;
  context *pcVar3;
  session_interface *psVar4;
  peer_connection *ppVar5;
  _List_node_base *p_Var6;
  peer_list *this_02;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Var7;
  undefined1 auVar8 [16];
  pointer pppVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  undefined4 extraout_var;
  __visit_result_t<libtorrent::aux::ssl_handle_visitor,_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
  s;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  peer_class *ppVar19;
  undefined4 extraout_var_04;
  peer_connection *ppVar20;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  int __type;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  endpoint *ep_02;
  element_type *peVar21;
  pointer pppVar22;
  _List_node_base *p_Var23;
  ulong uVar24;
  pointer pppVar25;
  long lVar26;
  torrent_state st;
  undefined1 local_148 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  pointer local_128;
  shared_ptr<libtorrent::peer_plugin> local_120;
  undefined8 local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  undefined1 local_100 [160];
  element_type *local_60;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<libtorrent::aux::peer_connection> local_40;
  short *psVar18;
  
  if ((this->field_0x5e0 & 2) != 0) {
    s = ::std::
        visit<libtorrent::aux::ssl_handle_visitor,std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
                  ((ssl_handle_visitor *)local_100,
                   &(p->m_socket).
                    super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                  );
    if (s == (__visit_result_t<libtorrent::aux::ssl_handle_visitor,_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
              )0x0) {
      local_100._0_16_ = (undefined1  [16])errors::make_error_code(requires_ssl_connection);
      (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,local_100,1,0);
      return false;
    }
    pcVar3 = (this->m_ssl_ctx)._M_t.
             super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
             .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
    if (pcVar3 == (context *)0x0) {
      local_100._0_16_ = (undefined1  [16])errors::make_error_code(invalid_ssl_cert);
      (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,local_100,0x11,0);
      return false;
    }
    bVar12 = aux::ssl::has_context(s,pcVar3->handle_);
    if (!bVar12) {
      local_100._0_16_ = (undefined1  [16])errors::make_error_code(invalid_ssl_cert);
      (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,local_100,1,0);
      return false;
    }
  }
  this->field_0x5c0 = this->field_0x5c0 | 4;
  if (((*(uint *)&this->field_0x5d8 >> 0x19 & 1) != 0) &&
     (this_01 = (this->m_ip_filter).
                super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     this_01 != (ip_filter *)0x0)) {
    iVar13 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(p);
    psVar18 = (short *)CONCAT44(extraout_var,iVar13);
    if (*psVar18 == 2) {
      local_100._0_16_ = ZEXT416(*(uint *)(psVar18 + 2)) << 0x20;
      local_100._16_8_ =
           (_Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
            )0x0;
      local_100._24_8_ = (element_type *)0x0;
    }
    else {
      local_100._16_8_ =
           ((tuple<libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
             *)(psVar18 + 8))->
           super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
      ;
      local_100._24_8_ = ZEXT48(*(uint *)(psVar18 + 0xc));
      local_100._8_8_ = *(error_category **)(psVar18 + 4);
      local_100._0_8_ = 1;
    }
    uVar14 = ip_filter::access(this_01,local_100,__type);
    if ((uVar14 & 1) != 0) {
      iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_00,iVar13) + 0x68) >> 8 & 1) != 0) {
        iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_100);
        iVar15 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(p);
        auVar8._12_4_ = 0;
        auVar8._0_12_ = stack0xfffffffffffffebc;
        _local_148 = (error_code)(auVar8 << 0x20);
        alert_manager::
        emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::peer_blocked_alert::reason_t>
                  ((alert_manager *)CONCAT44(extraout_var_01,iVar13),(torrent_handle *)local_100,
                   (basic_endpoint<boost::asio::ip::tcp> *)CONCAT44(extraout_var_02,iVar15),
                   (reason_t *)local_148);
        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_100._8_8_ !=
            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)(local_100._8_8_ + 0xc);
            iVar13 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar13 = *(_Atomic_word *)(local_100._8_8_ + 0xc);
            *(int *)(local_100._8_8_ + 0xc) = iVar13 + -1;
          }
          if (iVar13 == 1) {
            (*(*(_func_int ***)local_100._8_8_)[3])();
          }
        }
      }
      local_100._0_16_ = (undefined1  [16])errors::make_error_code(banned_by_ip_filter);
      (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,local_100,1,0);
      return false;
    }
  }
  if ((3 < ((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 6)
           - 2) &&
     (0 < (((this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length)) {
    local_100._0_16_ = (undefined1  [16])errors::make_error_code(torrent_not_ready);
    (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,local_100,1,0);
    return false;
  }
  psVar4 = (this->super_torrent_hot_members).m_ses;
  iVar13 = (*(psVar4->super_session_logger)._vptr_session_logger[9])(psVar4,p);
  if ((char)iVar13 == '\0') {
    local_100._0_16_ = (undefined1  [16])errors::make_error_code(peer_not_constructed);
    (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,local_100,1,0);
    return false;
  }
  iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x11])();
  if ((char)iVar13 != '\0') {
    local_100._0_16_ = (undefined1  [16])errors::make_error_code(session_closing);
    (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,local_100,1,0);
    return false;
  }
  if ((char)(p->super_peer_connection_hot_members).field_0x2c < '\x01') {
    uVar14 = 0;
  }
  else {
    lVar26 = 0;
    uVar14 = 0;
    do {
      c.m_val = *(uint *)(&p->field_0x38 + lVar26 * 4);
      iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[0x32])();
      ppVar19 = peer_class_pool::at((peer_class_pool *)CONCAT44(extraout_var_03,iVar13),c);
      if (ppVar19 != (peer_class *)0x0) {
        iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x32])();
        ppVar19 = peer_class_pool::at((peer_class_pool *)CONCAT44(extraout_var_04,iVar13),c);
        if ((int)uVar14 <= ppVar19->connection_limit_factor) {
          uVar14 = ppVar19->connection_limit_factor;
        }
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < (char)(p->super_peer_connection_hot_members).field_0x2c);
  }
  uVar24 = 100;
  if (uVar14 != 0) {
    uVar24 = (ulong)uVar14;
  }
  uVar14 = (uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x21);
  local_128 = (pointer)0x0;
  pppVar25 = (this->super_torrent_hot_members).m_connections.
             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             .
             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (((long)(((ulong)(uVar14 & 0xffffff) * 100) / uVar24) <=
       (long)(int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                                 super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 .
                                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pppVar25) >> 3))
     && (local_128 = (pointer)0x1, (uVar14 & 0xfffffe) / 10 < (uint)this->m_num_connecting)) {
    local_128 = (this->super_torrent_hot_members).m_connections.
                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                .
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pppVar22 = pppVar25 + 1;
    if (pppVar22 != local_128 && pppVar25 != local_128) {
      do {
        ppVar20 = *pppVar25;
        ppVar5 = *pppVar22;
        bVar11 = 0;
        bVar10 = 0;
        if (((ppVar20->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
          iVar13 = (*(ppVar20->super_bandwidth_socket)._vptr_bandwidth_socket[1])(ppVar20);
          bVar10 = (byte)iVar13 ^ 1;
        }
        if (((ppVar5->super_peer_connection_hot_members).field_0x28 & 2) != 0) {
          iVar13 = (*(ppVar5->super_bandwidth_socket)._vptr_bandwidth_socket[1])(ppVar5);
          bVar11 = (byte)iVar13 ^ 1;
        }
        bVar12 = bVar10 < bVar11;
        if (bVar10 == bVar11) {
          bVar12 = (ppVar5->m_connect).__d.__r < (ppVar20->m_connect).__d.__r;
        }
        pppVar9 = pppVar22;
        if (!bVar12) {
          pppVar9 = pppVar25;
        }
        pppVar25 = pppVar9;
        pppVar22 = pppVar22 + 1;
      } while (pppVar22 != local_128);
    }
    if (((pppVar25 ==
          (this->super_torrent_hot_members).m_connections.
          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          .
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) ||
        ((((*pppVar25)->super_peer_connection_hot_members).field_0x28 & 2) == 0)) ||
       (iVar13 = (*((*pppVar25)->super_bandwidth_socket)._vptr_bandwidth_socket[1])(),
       (char)iVar13 != '\0')) {
      local_100._0_16_ = (undefined1  [16])errors::make_error_code(too_many_connections);
      (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,local_100,1,0);
      return false;
    }
    ppVar20 = *pppVar25;
    local_100._0_16_ = (undefined1  [16])errors::make_error_code(too_many_connections);
    (*(ppVar20->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar20,local_100,1,0);
    p->field_0x887 = p->field_0x887 & 0xef;
    local_128 = (pointer)0x0;
  }
  p_Var23 = (this->m_extensions).
            super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var23 != (_List_node_base *)&this->m_extensions) {
    do {
      p_Var6 = p_Var23[1]._M_next;
      ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::peer_connection,void>
                ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
                 &local_110,
                 (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                 &p->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
      if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_108->_M_weak_count = local_108->_M_weak_count + 1;
          UNLOCK();
        }
        else {
          local_108->_M_weak_count = local_108->_M_weak_count + 1;
        }
      }
      local_140 = local_108;
      local_148._0_4_ = (undefined4)local_110;
      local_148[4] = (bool)local_110._4_1_;
      local_148._5_3_ = local_110._5_3_;
      (**(code **)((long)p_Var6->_M_next + 0x10))(local_100,p_Var6,local_148);
      if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)((long)&local_140->_M_use_count + 4);
          iVar13 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
        }
        else {
          iVar13 = *(int *)((long)&local_140->_M_use_count + 4);
          *(int *)((long)&local_140->_M_use_count + 4) = iVar13 + -1;
        }
        if (iVar13 == 1) {
          (*local_140->_vptr__Sp_counted_base[3])();
        }
      }
      if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
      }
      if ((_func_int **)local_100._0_8_ != (_func_int **)0x0) {
        local_120.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_100._0_8_;
        local_120.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_;
        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_100._8_8_ !=
            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_100._8_8_ + 8) = (int)*(ulong_long_type *)(local_100._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_100._8_8_ + 8) = (int)*(ulong_long_type *)(local_100._8_8_ + 8) + 1;
          }
        }
        peer_connection::add_extension(p,&local_120);
        if ((_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_120.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (piece_picker *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_120.
                     super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )local_100._8_8_ !=
          (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           )0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
      }
      p_Var23 = p_Var23->_M_next;
    } while (p_Var23 != (_List_node_base *)&this->m_extensions);
  }
  get_peer_list_state((torrent_state *)local_100,this);
  need_peer_list(this);
  this_02 = (this->super_torrent_hot_members).m_peer_list._M_t.
            super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
            ._M_t.
            super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
            .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
  uVar14 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0xf])();
  bVar12 = peer_list::new_connection
                     (this_02,&p->super_peer_connection_interface,uVar14 & 0xffff,
                      (torrent_state *)local_100);
  _Var7._M_head_impl =
       (this->super_torrent_hot_members).m_picker._M_t.
       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
       ._M_t.
       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
  if (bVar12) {
    peVar21 = (element_type *)local_100._152_8_;
    if (_Var7._M_head_impl != (piece_picker *)0x0) {
      for (; peVar21 != local_60; peVar21 = (element_type *)&peVar21->super_torrent_hot_members) {
        piece_picker::clear_peer
                  ((this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                   (torrent_peer *)(peVar21->super_request_callback)._vptr_request_callback);
      }
    }
    ::std::
    vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
    ::reserve(&this->m_peers_to_disconnect,
              ((long)(this->super_torrent_hot_members).m_connections.
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     .
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_torrent_hot_members).m_connections.
                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     .
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
    this_00 = &(this->super_torrent_hot_members).m_connections;
    ::std::
    vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ::reserve(&this_00->
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ,((long)(this->super_torrent_hot_members).m_connections.
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      .
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->super_torrent_hot_members).m_connections.
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      .
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
    if ((char)local_128 == '\0') {
LAB_0033145a:
      if (((this->super_torrent_hot_members).field_0x4b & 0x20) != 0) {
        recalc_share_mode(this);
      }
      sorted_insert<libtorrent::aux::peer_connection*,libtorrent::aux::peer_connection*>
                (&this_00->
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ,p);
      update_want_peers(this);
      bVar12 = want_tick(this);
      update_list(this,(torrent_list_index_t)0x1,bVar12);
      iVar13 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
      if ((CONCAT44(extraout_var_06,iVar13) != 0) &&
         (iVar13 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[7])(),
         (*(byte *)(CONCAT44(extraout_var_07,iVar13) + 0x1b) & 0x80) != 0)) {
        this->m_num_seeds = this->m_num_seeds + 1;
      }
      iVar13 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
      bVar12 = true;
      if ((char)iVar13 != '\0') {
        iVar13 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
        print_endpoint_abi_cxx11_((string *)local_148,(aux *)CONCAT44(extraout_var_08,iVar13),ep_00)
        ;
        uVar14 = (int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                                     super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     .
                                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->super_torrent_hot_members).m_connections.
                                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                    .
                                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                 (int)((ulong)((long)(this->m_peers_to_disconnect).
                                     super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_peers_to_disconnect).
                                    super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"ATTACHED CONNECTION \"%s\" connections: %d limit: %d num-peers: %d",
                   local_148,(ulong)uVar14,
                   (ulong)((uint)((ulong)*(undefined8 *)
                                          &(this->super_torrent_hot_members).field_0x48 >> 0x21) &
                          0xffffff),(ulong)uVar14);
        if (local_148 != (undefined1  [8])&local_138) {
          operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
        }
      }
      goto LAB_0033160f;
    }
    ppVar20 = find_lowest_ranking_peer(this);
    if (ppVar20 != (peer_connection *)0x0) {
      uVar16 = peer_connection::peer_rank(ppVar20);
      uVar17 = peer_connection::peer_rank(p);
      if (uVar16 < uVar17) {
        iVar13 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
        if ((char)iVar13 != '\0') {
          iVar13 = (*(ppVar20->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(ppVar20);
          print_endpoint_abi_cxx11_((string *)local_148,(aux *)CONCAT44(extraout_var_05,iVar13),ep);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,
                     "CLOSING CONNECTION \"%s\" peer list full (low peer rank) connections: %d limit: %d"
                     ,local_148,
                     (ulong)(uint)((int)((ulong)((long)(this->super_torrent_hot_members).
                                                       m_connections.
                                                                                                              
                                                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this->super_torrent_hot_members).
                                                      m_connections.
                                                                                                            
                                                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                                  (int)((ulong)((long)(this->m_peers_to_disconnect).
                                                                                                            
                                                  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)(this->m_peers_to_disconnect).
                                                                                                          
                                                  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4)),
                     (ulong)((uint)((ulong)*(undefined8 *)
                                            &(this->super_torrent_hot_members).field_0x48 >> 0x21) &
                            0xffffff));
          if (local_148 != (undefined1  [8])&local_138) {
            operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
          }
        }
        _local_148 = errors::make_error_code(too_many_connections);
        (*(ppVar20->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar20,local_148,1,0);
        p->field_0x887 = p->field_0x887 & 0xef;
        goto LAB_0033145a;
      }
    }
    iVar13 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar13 != '\0') {
      iVar13 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
      print_endpoint_abi_cxx11_((string *)local_148,(aux *)CONCAT44(extraout_var_10,iVar13),ep_02);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,
                 "CLOSING CONNECTION \"%s\" peer list full (low peer rank) connections: %d limit: %d"
                 ,local_148,
                 (ulong)(uint)((int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                                                                                                      
                                                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->super_torrent_hot_members).m_connections.
                                                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                              (int)((ulong)((long)(this->m_peers_to_disconnect).
                                                  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->m_peers_to_disconnect).
                                                 super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4)),
                 (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                               >> 0x21) & 0xffffff));
      if (local_148 != (undefined1  [8])&local_138) {
        operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
      }
    }
    _local_148 = errors::make_error_code(too_many_connections);
    (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,local_148,1,0);
    ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::peer_connection,void>
              ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)
               &local_40,
               (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
               &p->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
    remove_peer(this,&local_40);
    if (local_40.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.
                 super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    peVar21 = (element_type *)local_100._152_8_;
    if (_Var7._M_head_impl != (piece_picker *)0x0) {
      for (; peVar21 != local_60; peVar21 = (element_type *)&peVar21->super_torrent_hot_members) {
        piece_picker::clear_peer
                  ((this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                   (torrent_peer *)(peVar21->super_request_callback)._vptr_request_callback);
      }
    }
    iVar13 = (*(this->super_request_callback)._vptr_request_callback[6])(this);
    if ((char)iVar13 != '\0') {
      iVar13 = (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
      print_endpoint_abi_cxx11_((string *)local_148,(aux *)CONCAT44(extraout_var_09,iVar13),ep_01);
      (*(this->super_request_callback)._vptr_request_callback[7])
                (this,"CLOSING CONNECTION \"%s\" peer list full connections: %d limit: %d",local_148
                 ,(ulong)(uint)((int)((ulong)((long)(this->super_torrent_hot_members).m_connections.
                                                                                                        
                                                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)(this->super_torrent_hot_members).m_connections.
                                                                                                      
                                                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  .
                                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) -
                               (int)((ulong)((long)(this->m_peers_to_disconnect).
                                                                                                      
                                                  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->m_peers_to_disconnect).
                                                  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4)),
                 (ulong)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                               >> 0x21) & 0xffffff));
      if (local_148 != (undefined1  [8])&local_138) {
        operator_delete((void *)local_148,local_138._M_allocated_capacity + 1);
      }
    }
    _local_148 = errors::make_error_code(too_many_connections);
    (*(p->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(p,local_148,1,0);
  }
  bVar12 = false;
LAB_0033160f:
  if ((element_type *)local_100._152_8_ != (element_type *)0x0) {
    operator_delete((void *)local_100._152_8_,(long)local_58._M_pi - local_100._152_8_);
    return bVar12;
  }
  return bVar12;
}

Assistant:

bool torrent::attach_peer(peer_connection* p) try
	{
//		INVARIANT_CHECK;

#ifdef TORRENT_SSL_PEERS
		if (is_ssl_torrent())
		{
			// if this is an SSL torrent, don't allow non SSL peers on it
			aux::socket_type& s = p->get_socket();

			ssl::stream_handle_type stream_handle = std::visit(ssl_handle_visitor{}, s.var());

			if (!stream_handle)
			{
				// don't allow non SSL peers on SSL torrents
				p->disconnect(errors::requires_ssl_connection, operation_t::bittorrent);
				return false;
			}

			if (!m_ssl_ctx)
			{
				// we don't have a valid cert, don't accept any connection!
				p->disconnect(errors::invalid_ssl_cert, operation_t::ssl_handshake);
				return false;
			}

			if (!ssl::has_context(stream_handle, ssl::get_handle(*m_ssl_ctx)))
			{
				// if the SSL context associated with this connection is
				// not the one belonging to this torrent, the SSL handshake
				// connected to one torrent, and the BitTorrent protocol
				// to a different one. This is probably an attempt to circumvent
				// access control. Don't allow it.
				p->disconnect(errors::invalid_ssl_cert, operation_t::bittorrent);
				return false;
			}
		}
#else // TORRENT_SSL_PEERS
		if (is_ssl_torrent())
		{
			// Don't accidentally allow seeding of SSL torrents, just
			// because libtorrent wasn't built with SSL support
			p->disconnect(errors::requires_ssl_connection, operation_t::ssl_handshake);
			return false;
		}
#endif // TORRENT_SSL_PEERS

		TORRENT_ASSERT(p != nullptr);
		TORRENT_ASSERT(!p->is_outgoing());

		m_has_incoming = true;

		if (m_apply_ip_filter
			&& m_ip_filter
			&& m_ip_filter->access(p->remote().address()) & ip_filter::blocked)
		{
			if (m_ses.alerts().should_post<peer_blocked_alert>())
				m_ses.alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, p->remote(), peer_blocked_alert::ip_filter);
			p->disconnect(errors::banned_by_ip_filter, operation_t::bittorrent);
			return false;
		}

		if (!is_downloading_state(m_state) && valid_metadata())
		{
			p->disconnect(errors::torrent_not_ready, operation_t::bittorrent);
			return false;
		}

		if (!m_ses.has_connection(p))
		{
			p->disconnect(errors::peer_not_constructed, operation_t::bittorrent);
			return false;
		}

		if (m_ses.is_aborted())
		{
			p->disconnect(errors::session_closing, operation_t::bittorrent);
			return false;
		}

		int connection_limit_factor = 0;
		for (int i = 0; i < p->num_classes(); ++i)
		{
			peer_class_t pc = p->class_at(i);
			if (m_ses.peer_classes().at(pc) == nullptr) continue;
			int f = m_ses.peer_classes().at(pc)->connection_limit_factor;
			if (connection_limit_factor < f) connection_limit_factor = f;
		}
		if (connection_limit_factor == 0) connection_limit_factor = 100;

		std::int64_t const limit = std::int64_t(m_max_connections) * 100 / connection_limit_factor;

		bool maybe_replace_peer = false;

		if (m_connections.end_index() >= limit)
		{
			// if more than 10% of the connections are outgoing
			// connection attempts that haven't completed yet,
			// disconnect one of them and let this incoming
			// connection through.
			if (m_num_connecting > m_max_connections / 10)
			{
				// find one of the connecting peers and disconnect it
				// find any peer that's connecting (i.e. a half-open TCP connection)
				// that's also not disconnecting
				// disconnect the peer that's been waiting to establish a connection
				// the longest
				auto i = std::max_element(begin(), end(), &connecting_time_compare);

				if (i == end() || !(*i)->is_connecting() || (*i)->is_disconnecting())
				{
					// this seems odd, but we might as well handle it
					p->disconnect(errors::too_many_connections, operation_t::bittorrent);
					return false;
				}
				(*i)->disconnect(errors::too_many_connections, operation_t::bittorrent);

				// if this peer was let in via connections slack,
				// it has done its duty of causing the disconnection
				// of another peer
				p->peer_disconnected_other();
			}
			else
			{
				maybe_replace_peer = true;
			}
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			std::shared_ptr<peer_plugin> pp(ext->new_connection(
					peer_connection_handle(p->self())));
			if (pp) p->add_extension(pp);
		}
#endif
		torrent_state st = get_peer_list_state();
		need_peer_list();
		if (!m_peer_list->new_connection(*p, m_ses.session_time(), &st))
		{
			peers_erased(st.erased);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				debug_log("CLOSING CONNECTION \"%s\" peer list full "
					"connections: %d limit: %d"
					, print_endpoint(p->remote()).c_str()
					, num_peers()
					, m_max_connections);
			}
#endif
			p->disconnect(errors::too_many_connections, operation_t::bittorrent);
			return false;
		}
		peers_erased(st.erased);

		m_peers_to_disconnect.reserve(m_connections.size() + 1);
		m_connections.reserve(m_connections.size() + 1);

#if TORRENT_USE_ASSERTS
		error_code ec;
		TORRENT_ASSERT(p->remote() == p->get_socket().remote_endpoint(ec) || ec);
#endif

		TORRENT_ASSERT(p->peer_info_struct() != nullptr);

		// we need to do this after we've added the peer to the peer_list
		// since that's when the peer is assigned its peer_info object,
		// which holds the rank
		if (maybe_replace_peer)
		{
			// now, find the lowest rank peer and disconnect that
			// if it's lower rank than the incoming connection
			peer_connection* peer = find_lowest_ranking_peer();

			// TODO: 2 if peer is a really good peer, maybe we shouldn't disconnect it
			// perhaps this logic should be disabled if we have too many idle peers
			// (with some definition of idle)
			if (peer != nullptr && peer->peer_rank() < p->peer_rank())
			{
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					debug_log("CLOSING CONNECTION \"%s\" peer list full (low peer rank) "
						"connections: %d limit: %d"
						, print_endpoint(peer->remote()).c_str()
						, num_peers()
						, m_max_connections);
				}
#endif
				peer->disconnect(errors::too_many_connections, operation_t::bittorrent);
				p->peer_disconnected_other();
			}
			else
			{
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log())
				{
					debug_log("CLOSING CONNECTION \"%s\" peer list full (low peer rank) "
						"connections: %d limit: %d"
						, print_endpoint(p->remote()).c_str()
						, num_peers()
						, m_max_connections);
				}
#endif
				p->disconnect(errors::too_many_connections, operation_t::bittorrent);
				// we have to do this here because from the peer's point of view
				// it wasn't really attached to the torrent, but we do need
				// to let peer_list know we're removing it
				remove_peer(p->self());
				return false;
			}
		}

#if TORRENT_USE_INVARIANT_CHECKS
		if (m_peer_list) m_peer_list->check_invariant();
#endif

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_share_mode)
			recalc_share_mode();
#endif

		// once we add the peer to our m_connections list, we can't throw an
		// exception. That will end up violating an invariant between the session,
		// torrent and peers
		TORRENT_ASSERT(sorted_find(m_connections, p) == m_connections.end());
		TORRENT_ASSERT(m_iterating_connections == 0);
		sorted_insert(m_connections, p);
		update_want_peers();
		update_want_tick();

		if (p->peer_info_struct() && p->peer_info_struct()->seed)
		{
			TORRENT_ASSERT(m_num_seeds < 0xffff);
			++m_num_seeds;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log()) try
		{
			debug_log("ATTACHED CONNECTION \"%s\" connections: %d limit: %d num-peers: %d"
				, print_endpoint(p->remote()).c_str(), num_peers()
				, m_max_connections
				, num_peers());
		}
		catch (std::exception const&) {}
#endif

		return true;
	}
	catch (...)
	{
		p->disconnect(errors::torrent_not_ready, operation_t::bittorrent);
		// from the peer's point of view it was never really added to the torrent.
		// So we need to clean it up here before propagating the error
		remove_peer(p->self());
		return false;
	}